

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

int stbi__free_jpeg_components(stbi__jpeg *z,int ncomp,int why)

{
  long lVar1;
  undefined8 *puVar2;
  long lVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  ulong uVar4;
  ulong uVar5;
  long *in_FS_OFFSET;
  undefined1 auVar6 [12];
  
  lVar3 = *in_FS_OFFSET;
  lVar1 = lVar3 + -0x430;
  uVar5 = 0;
  uVar4 = (ulong)(uint)ncomp;
  if (ncomp < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 * 0x60 - uVar5 != 0; uVar5 = uVar5 + 0x60) {
    if (*(long *)((long)&z->img_comp[0].raw_data + uVar5) != 0) {
      (*(code *)in_FS_OFFSET[-0x85])(lVar1,3,why);
      puVar2 = (undefined8 *)((long)&z->img_comp[0].data + uVar5);
      *puVar2 = 0;
      puVar2[1] = 0;
      why = extraout_EDX;
    }
    if (*(long *)((long)&z->img_comp[0].raw_coeff + uVar5) != 0) {
      (*(code *)in_FS_OFFSET[-0x85])(lVar1,3);
      *(undefined8 *)((long)&z->img_comp[0].raw_coeff + uVar5) = 0;
      *(undefined8 *)((long)&z->img_comp[0].coeff + uVar5) = 0;
      why = extraout_EDX_00;
    }
    lVar3 = *(long *)((long)&z->img_comp[0].linebuf + uVar5);
    auVar6._8_4_ = why;
    auVar6._0_8_ = lVar3;
    if (lVar3 != 0) {
      auVar6 = (*(code *)in_FS_OFFSET[-0x85])(lVar1,3);
      *(undefined8 *)((long)&z->img_comp[0].linebuf + uVar5) = 0;
    }
    why = auVar6._8_4_;
    lVar3 = auVar6._0_8_;
  }
  return (int)lVar3;
}

Assistant:

static int stbi__free_jpeg_components(stbi__jpeg *z, int ncomp, int why)
{
   int i;
   for (i=0; i < ncomp; ++i) {
      if (z->img_comp[i].raw_data) {
         STBI_FREE(z->img_comp[i].raw_data);
         z->img_comp[i].raw_data = NULL;
         z->img_comp[i].data = NULL;
      }
      if (z->img_comp[i].raw_coeff) {
         STBI_FREE(z->img_comp[i].raw_coeff);
         z->img_comp[i].raw_coeff = 0;
         z->img_comp[i].coeff = 0;
      }
      if (z->img_comp[i].linebuf) {
         STBI_FREE(z->img_comp[i].linebuf);
         z->img_comp[i].linebuf = NULL;
      }
   }
   return why;
}